

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void anon_unknown.dwarf_7001::closeAndReset(TSocketDescriptor *sock)

{
  int *in_RDI;
  
  if (*in_RDI != -1) {
    shutdown(*in_RDI,0);
    close(*in_RDI);
    *in_RDI = -1;
  }
  return;
}

Assistant:

void closeAndReset(TSocketDescriptor & sock) {
        if (sock != -1) {
#ifndef __EMSCRIPTEN__
            shutdown(sock, 0);
#endif
            close(sock);
            sock = -1;
        }
    }